

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<std::array<float,_4UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<std::array<float,4ul>>
          (optional<std::array<float,_4UL>_> *__return_storage_ptr__,PrimVar *this)

{
  optional<std::array<float,_4UL>_> local_24;
  
  get_value<std::array<float,4ul>>(&local_24,this);
  __return_storage_ptr__->has_value_ = local_24.has_value_;
  if (local_24.has_value_ == true) {
    *(undefined8 *)&__return_storage_ptr__->contained = local_24.contained._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_24.contained._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }